

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void drawImage1(Array2D<Imf_3_2::Rgba> *px,int w,int h)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Rgba *__s;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if (0 < h) {
    lVar1 = px->_sizeY;
    __s = px->_data;
    uVar4 = (ulong)(uint)h;
    do {
      if (0 < w) {
        memset(__s,0,(ulong)(uint)w << 3);
      }
      __s = __s + lVar1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  fVar5 = (float)w;
  fVar6 = (float)(w / 2);
  fVar7 = (float)h;
  fVar8 = (float)(h / 2);
  uVar4 = 0;
  iVar2 = -0x2bc0;
  iVar3 = 1;
  do {
    dVar11 = (double)(((float)(iVar2 + 0x2bc0) * 3.1415927) / 5600.0);
    dVar12 = sin(dVar11 + dVar11);
    dVar13 = sin(dVar11 * 15.0);
    fVar9 = (float)(dVar13 * 0.2 + dVar12);
    dVar12 = cos(dVar11 * 3.0);
    dVar13 = cos(dVar11 * 15.0);
    fVar10 = (float)(dVar13 * 0.2 + dVar12);
    dVar12 = (double)fVar9;
    dVar13 = (double)((float)iVar3 / 5600.0);
    dVar14 = dVar13 * 0.3;
    dVar11 = dVar11 * 80.0;
    dVar15 = sin(dVar11);
    dVar16 = (double)fVar10;
    dVar17 = cos(dVar11);
    dVar18 = sin(dVar11 + 1.5707963267948966);
    dVar11 = cos(dVar11 + 1.5707963267948966);
    if (iVar3 + (int)(uVar4 / 10) * -10 == 1) {
      anon_unknown.dwarf_1092::sp
                (px,w,h,(fVar9 * fVar5) / 3.0 + fVar6,(fVar10 * fVar7) / 3.0 + fVar8,
                 (float)((double)w * 0.05 * dVar13),2.0,0.8,0.1,(float)(dVar13 * 0.5 * dVar13));
    }
    fVar9 = (float)((double)w * 0.01 * dVar13);
    fVar10 = (float)(dVar13 * 0.5 * dVar13);
    anon_unknown.dwarf_1092::sp
              (px,w,h,((float)(dVar15 * dVar14 + dVar12) * fVar5) / 3.0 + fVar6,
               ((float)(dVar17 * dVar14 + dVar16) * fVar7) / 3.0 + fVar8,fVar9,0.7,0.2,2.0,fVar10);
    anon_unknown.dwarf_1092::sp
              (px,w,h,((float)(dVar18 * dVar14 + dVar12) * fVar5) / 3.0 + fVar6,
               ((float)(dVar11 * dVar14 + dVar16) * fVar7) / 3.0 + fVar8,fVar9,0.2,1.5,0.1,fVar10);
    iVar3 = iVar3 + 1;
    uVar4 = (ulong)((int)uVar4 + 1);
    iVar2 = iVar2 + 2;
  } while (iVar2 != 0);
  return;
}

Assistant:

void
drawImage1 (Array2D<Rgba>& px, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = px[y][x];
            p.r     = 0;
            p.g     = 0;
            p.b     = 0;
            p.a     = 0;
        }
    }

    int n = 5600;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 2.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float r  = float (i + 1) / float (n);
        float xq = xp + 0.3 * r * sin (t * 80.0);
        float yq = yp + 0.3 * r * cos (t * 80.0);
        float xr = xp + 0.3 * r * sin (t * 80.0 + M_PI / 2);
        float yr = yp + 0.3 * r * cos (t * 80.0 + M_PI / 2);

        if (i % 10 == 0)
            sp (px,
                w,
                h,
                xp * w / 3 + w / 2,
                yp * h / 3 + h / 2,
                w * 0.05 * r,
                2.0,
                0.8,
                0.1,
                0.5 * r * r);

        sp (px,
            w,
            h,
            xq * w / 3 + w / 2,
            yq * h / 3 + h / 2,
            w * 0.01 * r,
            0.7,
            0.2,
            2.0,
            0.5 * r * r);

        sp (px,
            w,
            h,
            xr * w / 3 + w / 2,
            yr * h / 3 + h / 2,
            w * 0.01 * r,
            0.2,
            1.5,
            0.1,
            0.5 * r * r);
    }
}